

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O3

Promise<void> __thiscall
capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::Server::
dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  long lVar1;
  PromiseNode *extraout_RDX;
  undefined6 in_register_00000032;
  Promise<void> PVar3;
  PromiseNode *pPVar2;
  
  lVar1 = *(long *)CONCAT62(in_register_00000032,methodId);
  if ((int)context.hook == 0) {
    (**(code **)(lVar1 + 8))(this);
    pPVar2 = extraout_RDX;
  }
  else {
    PVar3 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,
                       (char *)((long)CONCAT62(in_register_00000032,methodId) +
                               *(long *)(lVar1 + -0x18)),0x4de87f,0x98cd);
    pPVar2 = PVar3.super_PromiseBase.node.ptr;
  }
  PVar3.super_PromiseBase.node.ptr = pPVar2;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar3.super_PromiseBase.node;
}

Assistant:

::kj::Promise<void> TestAuthenticatedBootstrap<VatId>::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return getCallerId(::capnp::Capability::Server::internalGetTypedContext<
          typename  ::capnproto_test::capnp::test::TestAuthenticatedBootstrap<VatId>::GetCallerIdParams, typename  ::capnproto_test::capnp::test::TestAuthenticatedBootstrap<VatId>::GetCallerIdResults>(context));
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestAuthenticatedBootstrap",
          0xea72cc77253798cdull, methodId);
  }
}